

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenAddTableImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName)

{
  IString *pIVar1;
  Table *pTVar2;
  undefined1 reuse;
  char *pcVar3;
  _Head_base<0UL,_wasm::Table_*,_false> _Var4;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view sVar5;
  _Head_base<0UL,_wasm::Table_*,_false> local_38;
  __single_object table;
  
  pcVar3 = externalBaseName;
  pIVar1 = (IString *)strlen(internalName);
  sVar5._M_str = (char *)0x0;
  sVar5._M_len = (size_t)internalName;
  reuse = SUB81(pcVar3,0);
  sVar5 = wasm::IString::interned(pIVar1,sVar5,(bool)reuse);
  pTVar2 = wasm::Module::getTableOrNull(module,(Name)sVar5);
  if (pTVar2 == (Table *)0x0) {
    pTVar2 = (Table *)operator_new(0x50);
    (pTVar2->max).addr = 0;
    (pTVar2->type).id = 0;
    (pTVar2->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    (pTVar2->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(pTVar2->super_Importable).super_Named.hasExplicitName = 0;
    (pTVar2->super_Importable).module.super_IString.str._M_len = 0;
    (pTVar2->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    (pTVar2->super_Importable).base.super_IString.str._M_len = 0;
    (pTVar2->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    (pTVar2->initial).addr = 0;
    (pTVar2->max).addr = 0xffffffff;
    wasm::Type::Type(&pTVar2->type,(HeapType)0x1,Nullable);
    local_38._M_head_impl = pTVar2;
    pIVar1 = (IString *)strlen(internalName);
    s_01._M_str = (char *)0x0;
    s_01._M_len = (size_t)internalName;
    sVar5 = wasm::IString::interned(pIVar1,s_01,(bool)reuse);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar5;
    _Var4._M_head_impl = local_38._M_head_impl;
    pIVar1 = (IString *)strlen(externalModuleName);
    s_02._M_str = (char *)0x0;
    s_02._M_len = (size_t)externalModuleName;
    sVar5 = wasm::IString::interned(pIVar1,s_02,SUB81(_Var4._M_head_impl,0));
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str = sVar5;
    _Var4._M_head_impl = local_38._M_head_impl;
    pIVar1 = (IString *)strlen(externalBaseName);
    s_03._M_str = (char *)0x0;
    s_03._M_len = (size_t)externalBaseName;
    sVar5 = wasm::IString::interned(pIVar1,s_03,SUB81(_Var4._M_head_impl,0));
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str = sVar5;
    wasm::Module::addTable
              (module,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_38);
    if (local_38._M_head_impl != (Table *)0x0) {
      operator_delete(local_38._M_head_impl,0x50);
    }
  }
  else {
    pIVar1 = (IString *)strlen(externalModuleName);
    s._M_str = (char *)0x0;
    s._M_len = (size_t)externalModuleName;
    sVar5 = wasm::IString::interned(pIVar1,s,(bool)reuse);
    (pTVar2->super_Importable).module.super_IString.str = sVar5;
    pIVar1 = (IString *)strlen(externalBaseName);
    s_00._M_str = (char *)0x0;
    s_00._M_len = (size_t)externalBaseName;
    sVar5 = wasm::IString::interned(pIVar1,s_00,(bool)reuse);
    (pTVar2->super_Importable).base.super_IString.str = sVar5;
  }
  return;
}

Assistant:

void BinaryenAddTableImport(BinaryenModuleRef module,
                            const char* internalName,
                            const char* externalModuleName,
                            const char* externalBaseName) {
  auto* table = ((Module*)module)->getTableOrNull(internalName);
  if (table == nullptr) {
    auto table = std::make_unique<Table>();
    table->name = internalName;
    table->module = externalModuleName;
    table->base = externalBaseName;
    ((Module*)module)->addTable(std::move(table));
  } else {
    // already exists so just set module and base
    table->module = externalModuleName;
    table->base = externalBaseName;
  }
}